

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

void deduct_cost(CHAR_DATA *ch,int cost)

{
  long lVar1;
  string_view fmt;
  
  lVar1 = ch->gold;
  if (lVar1 < cost) {
    cost = (int)lVar1;
  }
  ch->gold = lVar1 - cost;
  if (-1 < lVar1 - cost) {
    return;
  }
  fmt._M_str = "deduct costs: gold {} < 0";
  fmt._M_len = 0x19;
  CLogger::Warn<long&>((CLogger *)&RS.field_0x140,fmt,&ch->gold);
  ch->gold = 0;
  return;
}

Assistant:

void deduct_cost(CHAR_DATA *ch, int cost)
{
	int gold = 0;

	gold = std::min(ch->gold, (long)cost);

	ch->gold -= gold;

	if (ch->gold < 0)
	{
		RS.Logger.Warn("deduct costs: gold {} < 0", ch->gold);
		ch->gold = 0;
	}
}